

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

string * __thiscall
IDLExport::getIDLAbsolute_abi_cxx11_(string *__return_storage_ptr__,IDLExport *this,Type *type)

{
  string local_40;
  Type *local_20;
  Type *type_local;
  IDLExport *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (IDLExport *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40);
  anon_unknown.dwarf_1785d::getIDLAbsolute(__return_storage_ptr__,type,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLAbsolute(Type const& type) const
{
    return ::getIDLAbsolute(type, *this);
}